

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaAttDefList.cpp
# Opt level: O0

XMLAttDef * __thiscall
xercesc_4_0::SchemaAttDefList::getAttDef(SchemaAttDefList *this,XMLSize_t index)

{
  ArrayIndexOutOfBoundsException *this_00;
  MemoryManager *memoryManager;
  XMLSize_t index_local;
  SchemaAttDefList *this_local;
  
  if (this->fCount <= index) {
    this_00 = (ArrayIndexOutOfBoundsException *)__cxa_allocate_exception(0x30);
    memoryManager = XMLAttDefList::getMemoryManager(&this->super_XMLAttDefList);
    ArrayIndexOutOfBoundsException::ArrayIndexOutOfBoundsException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/SchemaAttDefList.cpp"
               ,0x7d,AttrList_BadIndex,memoryManager);
    __cxa_throw(this_00,&ArrayIndexOutOfBoundsException::typeinfo,
                ArrayIndexOutOfBoundsException::~ArrayIndexOutOfBoundsException);
  }
  return &this->fArray[index]->super_XMLAttDef;
}

Assistant:

XMLAttDef &SchemaAttDefList::getAttDef(XMLSize_t index)
{
    if(index >= fCount)
        ThrowXMLwithMemMgr(ArrayIndexOutOfBoundsException, XMLExcepts::AttrList_BadIndex, getMemoryManager());
    return *(fArray[index]);
}